

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::WildcardPortConnectionSyntax_const&>
          (BumpAllocator *this,WildcardPortConnectionSyntax *args)

{
  WildcardPortConnectionSyntax *pWVar1;
  WildcardPortConnectionSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pWVar1 = (WildcardPortConnectionSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::WildcardPortConnectionSyntax::WildcardPortConnectionSyntax(in_RSI,pWVar1);
  return pWVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }